

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

void __thiscall Liby::Socket::Socket(Socket *this,bool isUdp_)

{
  bool isUdp__local;
  Socket *this_local;
  
  this->isUdp_ = isUdp_;
  this->fd_ = -1;
  std::shared_ptr<Liby::FileDescriptor>::shared_ptr(&this->fp_);
  Endpoint::Endpoint(&this->ep_,0,0);
  createSocket(this);
  return;
}

Assistant:

Socket::Socket(bool isUdp_) : isUdp_(isUdp_) { createSocket(); }